

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O3

int __thiscall
ncnn::Slice::forward
          (Slice *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  uint uVar2;
  uint _c;
  pointer pMVar3;
  size_t _elemsize;
  void *pvVar4;
  size_t sVar5;
  int _c_00;
  long lVar6;
  ulong uVar7;
  pointer pMVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  void *pvVar14;
  int iVar15;
  ulong uVar16;
  void *__dest;
  long local_98;
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = pMVar3->dims;
  _elemsize = pMVar3->elemsize;
  pvVar4 = (this->slices).data;
  if (uVar2 == 1) {
    pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar8;
    if (lVar6 != 0) {
      iVar11 = pMVar3->w;
      uVar7 = (lVar6 >> 3) * -0x71c71c71c71c71c7;
      lVar13 = 0;
      lVar6 = 0;
      iVar12 = 0;
      uVar16 = 0;
      do {
        iVar15 = *(int *)((long)pvVar4 + uVar16 * 4);
        if (iVar15 == -0xe9) {
          iVar15 = (int)((ulong)((long)iVar11 - (long)iVar12) / (uVar7 + lVar6));
        }
        Mat::create((Mat *)((long)&pMVar8->data + lVar13),iVar15,_elemsize,opt->blob_allocator);
        pvVar14 = *(void **)((long)&pMVar8->data + lVar13);
        if (pvVar14 == (void *)0x0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar8->c + lVar13) * *(long *)((long)&pMVar8->cstep + lVar13) ==
            0) {
          return -100;
        }
        memcpy(pvVar14,(void *)(_elemsize * (long)iVar12 + (long)pMVar3->data),
               (long)iVar15 * _elemsize);
        iVar12 = iVar12 + iVar15;
        uVar16 = uVar16 + 1;
        pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar8 >> 3) *
                -0x71c71c71c71c71c7;
        lVar6 = lVar6 + -1;
        lVar13 = lVar13 + 0x48;
      } while (uVar16 < uVar7);
    }
  }
  else {
    iVar11 = (this->axis >> 0x1f & uVar2) + this->axis;
    if ((uVar2 == 2) && (iVar11 == 0)) {
      pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar8;
      if (lVar6 != 0) {
        iVar11 = pMVar3->w;
        iVar12 = pMVar3->h;
        uVar7 = (lVar6 >> 3) * -0x71c71c71c71c71c7;
        lVar6 = 0;
        lVar13 = 0;
        iVar15 = 0;
        uVar16 = 0;
        do {
          iVar9 = *(int *)((long)pvVar4 + uVar16 * 4);
          if (iVar9 == -0xe9) {
            iVar9 = (int)((ulong)((long)iVar12 - (long)iVar15) / (uVar7 + lVar13));
          }
          Mat::create((Mat *)((long)&pMVar8->data + lVar6),iVar11,iVar9,_elemsize,
                      opt->blob_allocator);
          pvVar14 = *(void **)((long)&pMVar8->data + lVar6);
          if (pvVar14 == (void *)0x0) {
            return -100;
          }
          if ((long)*(int *)((long)&pMVar8->c + lVar6) * *(long *)((long)&pMVar8->cstep + lVar6) ==
              0) {
            return -100;
          }
          memcpy(pvVar14,(void *)((long)pMVar3->w * (long)iVar15 * pMVar3->elemsize +
                                 (long)pMVar3->data),(long)(iVar9 * iVar11) * _elemsize);
          iVar15 = iVar15 + iVar9;
          uVar16 = uVar16 + 1;
          pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar7 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar8 >> 3) *
                  -0x71c71c71c71c71c7;
          lVar13 = lVar13 + -1;
          lVar6 = lVar6 + 0x48;
        } while (uVar16 < uVar7);
      }
    }
    else if ((uVar2 == 2) && (iVar11 == 1)) {
      pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar8;
      if (lVar6 != 0) {
        iVar11 = pMVar3->w;
        uVar2 = pMVar3->h;
        uVar7 = (lVar6 >> 3) * -0x71c71c71c71c71c7;
        iVar12 = 0;
        uVar16 = 0;
        do {
          iVar15 = *(int *)((long)pvVar4 + uVar16 * 4);
          if (iVar15 == -0xe9) {
            iVar15 = (int)((ulong)((long)iVar11 - (long)iVar12) / (uVar7 - uVar16));
          }
          pMVar1 = pMVar8 + uVar16;
          Mat::create(pMVar1,iVar15,uVar2,_elemsize,opt->blob_allocator);
          if (pMVar1->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar1->c * pMVar1->cstep == 0) {
            return -100;
          }
          if (0 < (int)uVar2) {
            uVar7 = 0;
            do {
              memcpy((void *)((long)pMVar1->w * uVar7 * pMVar1->elemsize + (long)pMVar1->data),
                     (void *)((long)pMVar3->data +
                             (long)iVar12 * _elemsize + (long)pMVar3->w * uVar7 * pMVar3->elemsize),
                     (long)iVar15 * _elemsize);
              uVar7 = uVar7 + 1;
            } while (uVar2 != uVar7);
          }
          iVar12 = iVar12 + iVar15;
          uVar16 = uVar16 + 1;
          pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar7 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar8 >> 3) *
                  -0x71c71c71c71c71c7;
        } while (uVar16 < uVar7);
        return 0;
      }
    }
    else if ((uVar2 == 3) && (iVar11 == 0)) {
      pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar8;
      if (lVar6 != 0) {
        iVar11 = pMVar3->w;
        iVar12 = pMVar3->h;
        iVar15 = pMVar3->c;
        uVar7 = (lVar6 >> 3) * -0x71c71c71c71c71c7;
        lVar6 = 0;
        local_98 = 0;
        iVar9 = 0;
        uVar16 = 0;
        do {
          _c_00 = *(int *)((long)pvVar4 + uVar16 * 4);
          if (_c_00 == -0xe9) {
            _c_00 = (int)((ulong)((long)iVar15 - (long)iVar9) / (uVar7 + local_98));
          }
          Mat::create((Mat *)((long)&pMVar8->data + lVar6),iVar11,iVar12,_c_00,_elemsize,
                      opt->blob_allocator);
          pvVar14 = *(void **)((long)&pMVar8->data + lVar6);
          if (pvVar14 == (void *)0x0) {
            return -100;
          }
          if ((long)*(int *)((long)&pMVar8->c + lVar6) * *(long *)((long)&pMVar8->cstep + lVar6) ==
              0) {
            return -100;
          }
          memcpy(pvVar14,(void *)(pMVar3->cstep * (long)iVar9 * pMVar3->elemsize +
                                 (long)pMVar3->data),(long)(_c_00 * (int)pMVar3->cstep) * _elemsize)
          ;
          iVar9 = iVar9 + _c_00;
          uVar16 = uVar16 + 1;
          pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar7 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar8 >> 3) *
                  -0x71c71c71c71c71c7;
          local_98 = local_98 + -1;
          lVar6 = lVar6 + 0x48;
        } while (uVar16 < uVar7);
        return 0;
      }
    }
    else {
      if ((uVar2 != 3) || (iVar11 != 1)) {
        if (uVar2 != 3) {
          return 0;
        }
        if (iVar11 != 2) {
          return 0;
        }
        pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar6 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)pMVar8;
        if (lVar6 == 0) {
          return 0;
        }
        iVar11 = pMVar3->w;
        uVar2 = pMVar3->h;
        _c = pMVar3->c;
        uVar16 = (lVar6 >> 3) * -0x71c71c71c71c71c7;
        uVar7 = 0;
        iVar12 = 0;
        do {
          iVar15 = *(int *)((long)pvVar4 + uVar7 * 4);
          if (iVar15 == -0xe9) {
            iVar15 = (int)((ulong)((long)iVar11 - (long)iVar12) / (uVar16 - uVar7));
          }
          pMVar1 = pMVar8 + uVar7;
          Mat::create(pMVar1,iVar15,uVar2,_c,_elemsize,opt->blob_allocator);
          if (pMVar1->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar1->c * pMVar1->cstep == 0) {
            return -100;
          }
          if (0 < (int)_c) {
            uVar16 = 0;
            do {
              if (0 < (int)uVar2) {
                iVar9 = pMVar3->w;
                sVar5 = pMVar3->elemsize;
                __dest = (void *)(pMVar1->cstep * uVar16 * pMVar1->elemsize + (long)pMVar1->data);
                pvVar14 = (void *)((long)pMVar3->data +
                                  sVar5 * pMVar3->cstep * uVar16 + (long)iVar12 * _elemsize);
                uVar10 = (ulong)uVar2;
                do {
                  memcpy(__dest,pvVar14,(long)iVar15 * _elemsize);
                  __dest = (void *)((long)__dest + (long)iVar15 * _elemsize);
                  pvVar14 = (void *)((long)pvVar14 + (long)iVar9 * sVar5);
                  uVar10 = uVar10 - 1;
                } while (uVar10 != 0);
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 != _c);
          }
          iVar12 = iVar12 + iVar15;
          uVar7 = uVar7 + 1;
          pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar16 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar8 >> 3) *
                   -0x71c71c71c71c71c7;
        } while (uVar7 < uVar16);
        return 0;
      }
      pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar8;
      if (lVar6 != 0) {
        iVar11 = pMVar3->w;
        uVar2 = pMVar3->c;
        iVar12 = pMVar3->h;
        uVar16 = (lVar6 >> 3) * -0x71c71c71c71c71c7;
        uVar7 = 0;
        iVar15 = 0;
        do {
          iVar9 = *(int *)((long)pvVar4 + uVar7 * 4);
          if (iVar9 == -0xe9) {
            iVar9 = (int)((ulong)((long)iVar12 - (long)iVar15) / (uVar16 - uVar7));
          }
          pMVar1 = pMVar8 + uVar7;
          Mat::create(pMVar1,iVar11,iVar9,uVar2,_elemsize,opt->blob_allocator);
          if (pMVar1->data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar1->c * pMVar1->cstep == 0) {
            return -100;
          }
          if (0 < (int)uVar2) {
            uVar16 = 0;
            do {
              memcpy((void *)(pMVar1->cstep * uVar16 * pMVar1->elemsize + (long)pMVar1->data),
                     (void *)((long)pMVar3->data +
                             (long)pMVar3->w * (long)iVar15 * pMVar3->elemsize +
                             pMVar3->cstep * uVar16 * pMVar3->elemsize),
                     (long)(iVar9 * iVar11) * _elemsize);
              uVar16 = uVar16 + 1;
            } while (uVar2 != uVar16);
          }
          iVar15 = iVar15 + iVar9;
          uVar7 = uVar7 + 1;
          pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar16 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar8 >> 3) *
                   -0x71c71c71c71c71c7;
        } while (uVar7 < uVar16);
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

int Slice::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        int w = bottom_blob.w;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const unsigned char* ptr = (const unsigned char*)bottom_blob + q * elemsize;
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, slice * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * slice;

            const unsigned char* ptr = bottom_blob.row<const unsigned char>(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int j = 0; j < h; j++)
            {
                unsigned char* outptr = top_blob.row<unsigned char>(j);
                const unsigned char* ptr = bottom_blob.row<const unsigned char>(j) + q * elemsize;
                memcpy(outptr, ptr, slice * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((channels - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = static_cast<int>(bottom_blob.cstep * slice);

            const unsigned char* ptr = bottom_blob.channel(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                int size = w * slice;

                unsigned char* outptr = top_blob.channel(p);
                const unsigned char* ptr = bottom_blob.channel(p).row<const unsigned char>(q);
                memcpy(outptr, ptr, size * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                unsigned char* outptr = top_blob.channel(p);
                const Mat m = bottom_blob.channel(p);

                for (int j = 0; j < h; j++)
                {
                    const unsigned char* ptr = m.row<const unsigned char>(j) + q * elemsize;
                    memcpy(outptr, ptr, slice * elemsize);

                    outptr += slice * elemsize;
                }
            }

            q += slice;
        }

        return 0;
    }

    return 0;
}